

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

bool __thiscall moira::Moira::evalCond<(moira::Cond)10>(Moira *this)

{
  Moira *this_local;
  
  return (bool)(((this->reg).sr.n ^ 0xffU) & 1);
}

Assistant:

bool
Moira::evalCond() {

    switch (C) {

        case Cond::BT: return true;
        case Cond::BF: return false;
        case Cond::HI: return !reg.sr.c && !reg.sr.z;
        case Cond::LS: return reg.sr.c || reg.sr.z;
        case Cond::CC: return !reg.sr.c;
        case Cond::CS: return reg.sr.c;
        case Cond::NE: return !reg.sr.z;
        case Cond::EQ: return reg.sr.z;
        case Cond::VC: return !reg.sr.v;
        case Cond::VS: return reg.sr.v;
        case Cond::PL: return !reg.sr.n;
        case Cond::MI: return reg.sr.n;
        case Cond::GE: return reg.sr.n == reg.sr.v;
        case Cond::LT: return reg.sr.n != reg.sr.v;
        case Cond::GT: return reg.sr.n == reg.sr.v && !reg.sr.z;
        case Cond::LE: return reg.sr.n != reg.sr.v || reg.sr.z;

        default:
            fatalError;
    }
}